

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O3

PragmaFunction * __thiscall
duckdb::FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
          (PragmaFunction *__return_storage_ptr__,FunctionSet<duckdb::PragmaFunction> *this,
          idx_t offset)

{
  size_t sVar1;
  pragma_query_t p_Var2;
  undefined4 uVar3;
  undefined7 uVar4;
  reference pvVar5;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_18;
  
  pvVar5 = vector<duckdb::PragmaFunction,_true>::operator[](&this->functions,offset);
  SimpleFunction::SimpleFunction((SimpleFunction *)__return_storage_ptr__,(SimpleFunction *)pvVar5);
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
  _vptr_Function = (_func_int **)&PTR__SimpleNamedParameterFunction_0243ff38;
  local_18._M_h =
       (__hashtable_alloc *)
       &(__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count
       = (pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h._M_before_begin
  ._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h.
  _M_element_count =
       (pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count;
  uVar3 = *(undefined4 *)
           &(pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
            field_0x4;
  sVar1 = (pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
          _M_next_resize;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h.
  _M_rehash_policy._M_max_load_factor =
       (pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  *(undefined4 *)
   &(__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h.
    _M_rehash_policy.field_0x4 = uVar3;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h.
  _M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).named_parameters._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_18._M_h,&(pvVar5->super_SimpleNamedParameterFunction).named_parameters._M_h,
             &local_18);
  (__return_storage_ptr__->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
  _vptr_Function = (_func_int **)&PTR__PragmaFunction_02442970;
  uVar4 = *(undefined7 *)&pvVar5->field_0xc9;
  p_Var2 = pvVar5->query;
  __return_storage_ptr__->type = pvVar5->type;
  *(undefined7 *)&__return_storage_ptr__->field_0xc9 = uVar4;
  __return_storage_ptr__->query = p_Var2;
  __return_storage_ptr__->function = pvVar5->function;
  local_18._M_h = (__hashtable_alloc *)&__return_storage_ptr__->named_parameters;
  (__return_storage_ptr__->named_parameters)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->named_parameters)._M_h._M_bucket_count =
       (pvVar5->named_parameters)._M_h._M_bucket_count;
  (__return_storage_ptr__->named_parameters)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->named_parameters)._M_h._M_element_count =
       (pvVar5->named_parameters)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(pvVar5->named_parameters)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (pvVar5->named_parameters)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->named_parameters)._M_h._M_rehash_policy._M_max_load_factor =
       (pvVar5->named_parameters)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->named_parameters)._M_h._M_rehash_policy.field_0x4 = uVar3
  ;
  (__return_storage_ptr__->named_parameters)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->named_parameters)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_18._M_h,&(pvVar5->named_parameters)._M_h,&local_18);
  return __return_storage_ptr__;
}

Assistant:

T GetFunctionByOffset(idx_t offset) {
		D_ASSERT(offset < functions.size());
		return functions[offset];
	}